

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test7::logVariableContents(GPUShaderFP64Test7 *this,_variables *variables)

{
  ostringstream *this_00;
  int iVar1;
  _variable_type type;
  deUint32 dVar2;
  _variable_type _Var3;
  uint uVar4;
  undefined4 extraout_var;
  ostream *poVar6;
  uchar *data_ptr;
  uchar *puVar7;
  pointer p_Var8;
  uint uVar9;
  stringstream log_sstream;
  char *local_358 [4];
  stringstream local_338 [16];
  ostream local_328;
  undefined1 local_1b0 [384];
  long lVar5;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  std::__cxx11::stringstream::stringstream(local_338);
  std::operator<<(&local_328,"Test variable values as retrieved from geometry shader:\n");
  type = (**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glMapBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2807);
  for (p_Var8 = (variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_start;
      p_Var8 != (variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_finish; p_Var8 = p_Var8 + 1) {
    _Var3 = Utils::getBaseVariableType(p_Var8->type);
    uVar4 = Utils::getNumberOfComponentsForVariableType(p_Var8->type);
    for (puVar7 = (uchar *)0x0; puVar7 < (uchar *)(ulong)p_Var8->array_size; puVar7 = puVar7 + 1) {
      data_ptr = puVar7;
      poVar6 = std::operator<<(&local_328,"gs_variable");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      if (1 < p_Var8->array_size) {
        poVar6 = std::operator<<(&local_328,"[");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::operator<<(poVar6,"]");
      }
      std::operator<<(&local_328,": (");
      uVar9 = uVar4;
      while (uVar9 != 0) {
        Utils::getStringForVariableTypeValue_abi_cxx11_
                  ((string *)local_1b0,(Utils *)(ulong)_Var3,type,data_ptr);
        std::operator<<(&local_328,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
        if (uVar9 != 1) {
          std::operator<<(&local_328,", ");
        }
        type = type + VARIABLE_TYPE_DMAT3;
        uVar9 = uVar9 - 1;
      }
      std::operator<<(&local_328,")\n");
    }
  }
  (**(code **)(lVar5 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glUnmapBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2832);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this_00,local_358[0]);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)local_358);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::__cxx11::stringstream::~stringstream(local_338);
  return;
}

Assistant:

void GPUShaderFP64Test7::logVariableContents(const _variables& variables)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	std::stringstream	 log_sstream;

	log_sstream << "Test variable values as retrieved from geometry shader:\n";

	/* Map the XFB BO contents into process space */
	const void* xfb_bo_data = gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

	/* Read the variable contents. We only care about the set of varyings emitted
	 * for first vertex in the geometry shader */
	unsigned int		 n_varying	 = 0;
	const unsigned char* traveller_ptr = (const unsigned char*)xfb_bo_data;

	for (_variables_const_iterator variables_iterator = variables.begin(); variables_iterator != variables.end();
		 ++variables_iterator, ++n_varying)
	{
		const _variable&			 variable			= *variables_iterator;
		const Utils::_variable_type& base_variable_type = Utils::getBaseVariableType(variable.type);
		const unsigned int			 n_components		= Utils::getNumberOfComponentsForVariableType(variable.type);

		for (unsigned int array_index = 0; array_index < variable.array_size; ++array_index)
		{
			log_sstream << "gs_variable" << n_varying;

			if (variable.array_size > 1)
			{
				log_sstream << "[" << array_index << "]";
			}

			log_sstream << ": (";

			for (unsigned int n_component = 0; n_component < n_components; ++n_component)
			{
				log_sstream << Utils::getStringForVariableTypeValue(base_variable_type, traveller_ptr);

				if (n_component != (n_components - 1))
				{
					log_sstream << ", ";
				}

				traveller_ptr += sizeof(double);
			}

			log_sstream << ")\n";
		} /* for (all array indices) */
	}	 /* for (all variables) */

	/* Unmap the BO */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	/* Pass the logged stream into the framework */
	m_testCtx.getLog() << tcu::TestLog::Message << log_sstream.str().c_str() << tcu::TestLog::EndMessage;
}